

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void nodeHashDelete(Rtree *pRtree,RtreeNode *pNode)

{
  RtreeNode *pRVar1;
  RtreeNode **ppRVar2;
  RtreeNode **ppRVar3;
  
  if (pNode->iNode != 0) {
    ppRVar2 = pRtree->aHash + (pNode->iNode & 0xffffffffU) % 0x61;
    do {
      ppRVar3 = ppRVar2;
      pRVar1 = *ppRVar3;
      ppRVar2 = &pRVar1->pNext;
    } while (pRVar1 != pNode);
    *ppRVar3 = pNode->pNext;
    pNode->pNext = (RtreeNode *)0x0;
  }
  return;
}

Assistant:

static void nodeHashDelete(Rtree *pRtree, RtreeNode *pNode){
  RtreeNode **pp;
  if( pNode->iNode!=0 ){
    pp = &pRtree->aHash[nodeHash(pNode->iNode)];
    for( ; (*pp)!=pNode; pp = &(*pp)->pNext){ assert(*pp); }
    *pp = pNode->pNext;
    pNode->pNext = 0;
  }
}